

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere_info.cpp
# Opt level: O1

ostream * CGL::Collada::operator<<(ostream *os,SphereInfo *sphere)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"Sphere: ",8);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(sphere->super_Instance).name._M_dataplus._M_p,
                      (sphere->super_Instance).name._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," (id:",5);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(sphere->super_Instance).id._M_dataplus._M_p,
                      (sphere->super_Instance).id._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,") [",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," radius=",8);
  poVar1 = std::ostream::_M_insert<double>((double)sphere->radius);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ]",2);
  return poVar1;
}

Assistant:

std::ostream& operator<<( std::ostream& os, const SphereInfo& sphere ) {
  return os << "Sphere: " << sphere.name << " (id:" << sphere.id << ") ["
            << " radius=" << sphere.radius << " ]";
}